

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserialize_row.h
# Opt level: O3

vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
* psql::deserialize_row
            (vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
             *__return_storage_ptr__,
            vector<psql::field_metadata,_std::allocator<psql::field_metadata>_> *meta,
            bytestring *buffer)

{
  pointer *ppvVar1;
  uint uVar2;
  psql *ppVar3;
  iterator iVar4;
  char cVar5;
  system_error *this;
  runtime_error *prVar6;
  field_metadata *in_R8;
  psql *ppVar7;
  psql *ppVar8;
  ushort uVar9;
  long lVar10;
  undefined8 uVar11;
  string_view from;
  error_code eVar12;
  _Variadic_union<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  local_48;
  undefined1 local_38;
  undefined7 uStack_37;
  
  ppVar8 = (psql *)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (psql *)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 < ppVar8) {
    __assert_fail("last_ >= first_",
                  "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/serialization_ctx.h"
                  ,0x13,
                  "psql::deserialization_context::deserialization_context(const std::uint8_t *, const std::uint8_t *)"
                 );
  }
  if ((ulong)((long)ppVar3 - (long)ppVar8) < 2) {
    this = (system_error *)__cxa_allocate_exception(0x40);
    eVar12 = make_error_code(incomplete_message);
    boost::system::system_error::system_error(this,eVar12);
    __cxa_throw(this,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  ppVar7 = ppVar8 + 2;
  if (ppVar3 < ppVar7) {
LAB_0010fbf2:
    __assert_fail("last_ >= first_",
                  "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/serialization_ctx.h"
                  ,0x1c,"void psql::deserialization_context::advance(std::size_t)");
  }
  uVar9 = *(ushort *)ppVar8 << 8 | *(ushort *)ppVar8 >> 8;
  if (((long)(meta->super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>)
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(meta->super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>)
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
      (long)(short)uVar9 != 0) {
    __assert_fail("field_count == meta.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/deserialize_row.h"
                  ,0x3d,
                  "std::vector<value> psql::deserialize_row(const std::vector<field_metadata> &, const bytestring &)"
                 );
  }
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  ::reserve(__return_storage_ptr__,(long)(short)uVar9);
  if (0 < (short)uVar9) {
    lVar10 = 0;
    ppVar8 = ppVar7;
    do {
      if ((ulong)((long)ppVar3 - (long)ppVar8) < 4) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x40);
        eVar12 = make_error_code(incomplete_message);
        std::runtime_error::runtime_error(prVar6,"");
        goto LAB_0010fcb1;
      }
      ppVar7 = ppVar8 + 4;
      if (ppVar3 < ppVar7) goto LAB_0010fbf2;
      uVar2 = *(uint *)ppVar8;
      if (uVar2 == 0xffffffff) {
        local_48._M_rest._0_8_ = (undefined8)0;
        local_38 = 10;
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,std::allocator<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>>
          ::
          _M_realloc_insert<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>
                    ((vector<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,std::allocator<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>>
                      *)__return_storage_ptr__,iVar4,
                     (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                      *)&local_48._M_first);
        }
        else {
          *(ulong *)&((iVar4._M_current)->
                     super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     ).
                     super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     ._M_index = CONCAT71(uStack_37,10);
          *(undefined8 *)
           &((iVar4._M_current)->
            super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            ).
            super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            ._M_u = 0;
          *(undefined8 *)
           ((long)&((iVar4._M_current)->
                   super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   ).
                   super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   ._M_u + 8) = local_48._8_8_;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
      }
      else {
        ppVar8 = (psql *)(long)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                    | uVar2 << 0x18);
        if (ppVar3 + -(long)ppVar7 < ppVar8) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x40);
          if ((DAT_0011b368 == -0x70502de1da3a1f65) || (DAT_0011b368 == -0x4d54ee85da8120f3)) {
LAB_0010fc91:
            uVar11 = 0x100000001;
          }
          else {
            cVar5 = (**(code **)(psql_error_category + 0x30))(&psql_error_category,1);
            uVar11 = 1;
            if (cVar5 != '\0') goto LAB_0010fc91;
          }
          std::runtime_error::runtime_error(prVar6,"");
          eVar12.cat_ = (error_category *)&psql_error_category;
          eVar12.val_ = (int)uVar11;
          eVar12.failed_ = (bool)(char)((ulong)uVar11 >> 0x20);
          eVar12._5_3_ = (int3)((ulong)uVar11 >> 0x28);
LAB_0010fcb1:
          *(undefined ***)prVar6 = &PTR__system_error_0011a0b8;
          *(error_code *)(prVar6 + 0x10) = eVar12;
          *(runtime_error **)(prVar6 + 0x20) = prVar6 + 0x30;
          *(undefined8 *)(prVar6 + 0x28) = 0;
          prVar6[0x30] = (runtime_error)0x0;
          __cxa_throw(prVar6,&boost::system::system_error::typeinfo,
                      boost::system::system_error::~system_error);
        }
        from._M_str = (char *)((long)&(((meta->
                                        super__Vector_base<psql::field_metadata,_std::allocator<psql::field_metadata>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->msg_).name.
                                      super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>
                              + lVar10);
        from._M_len = (size_t)ppVar7;
        deserialize_single((value *)&local_48._M_first,ppVar8,from,in_R8);
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,std::allocator<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>>
          ::
          _M_realloc_insert<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>
                    ((vector<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,std::allocator<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>>>
                      *)__return_storage_ptr__,iVar4,
                     (variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                      *)&local_48._M_first);
        }
        else {
          *(ulong *)&((iVar4._M_current)->
                     super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     ).
                     super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     .
                     super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                     ._M_index = CONCAT71(uStack_37,local_38);
          *(_Uninitialized<long,_true> *)
           &((iVar4._M_current)->
            super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            ).
            super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            .
            super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
            ._M_u = local_48._M_rest._M_first._M_storage;
          *(undefined8 *)
           ((long)&((iVar4._M_current)->
                   super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   ).
                   super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   .
                   super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                   ._M_u + 8) = local_48._8_8_;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        ppVar7 = ppVar7 + (long)ppVar8;
        if (ppVar3 < ppVar7) goto LAB_0010fbf2;
      }
      lVar10 = lVar10 + 0x28;
      ppVar8 = ppVar7;
    } while ((ulong)uVar9 * 0x28 != lVar10);
  }
  if (ppVar3 == ppVar7) {
    return __return_storage_ptr__;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x40);
  if ((DAT_0011b368 != -0x70502de1da3a1f65) && (DAT_0011b368 != -0x4d54ee85da8120f3)) {
    cVar5 = (**(code **)(psql_error_category + 0x30))(&psql_error_category,3);
    uVar11 = 3;
    if (cVar5 == '\0') goto LAB_0010fdc4;
  }
  uVar11 = 0x100000003;
LAB_0010fdc4:
  std::runtime_error::runtime_error(prVar6,"");
  *(undefined ***)prVar6 = &PTR__system_error_0011a0b8;
  *(undefined8 *)(prVar6 + 0x10) = uVar11;
  *(long **)(prVar6 + 0x18) = &psql_error_category;
  *(runtime_error **)(prVar6 + 0x20) = prVar6 + 0x30;
  *(undefined8 *)(prVar6 + 0x28) = 0;
  prVar6[0x30] = (runtime_error)0x0;
  __cxa_throw(prVar6,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

inline std::vector<value> deserialize_row(
	const std::vector<field_metadata>& meta,
	const bytestring& buffer
)
{
	// Context
	deserialization_context ctx (buffer.data(), buffer.data() + buffer.size());

	// Field count
	std::int16_t field_count = 0;
	auto err = deserialize(field_count, ctx);
	check_error_code(err);
	assert(field_count == meta.size());

	// Each field
	std::vector<value> res;
	res.reserve(field_count);
	for (int i = 0; i < field_count; ++i)
	{
		std::int32_t size = 0;
		err = deserialize(size, ctx);
		check_error_code(err);
		if (size == -1)
		{
			// NULL
			res.push_back(value(nullptr));
		}
		else
		{
			if (!ctx.enough_size(size))
				throw boost::system::system_error(make_error_code(errc::incomplete_message));
			std::string_view buff = get_string(ctx.first(), size);
			res.push_back(deserialize_single(buff, meta[i]));
			ctx.advance(size);
		}
	}
	if (!ctx.empty())
		throw boost::system::system_error(make_error_code(errc::extra_bytes));
	return res;
}